

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O2

bool __thiscall
ZXing::DataMatrix::EdgeTracer::traceCorner(EdgeTracer *this,PointF dir,PointF *corner)

{
  undefined1 auVar1 [12];
  PointT<double> p;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int breadth;
  int iVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  PointT<double> pos;
  PointT<double> p_00;
  PointT<double> pos_00;
  PointT<double> pos_01;
  undefined1 local_68 [32];
  double local_48;
  double dStack_40;
  undefined1 auVar12 [16];
  
  BitMatrixCursor<ZXing::PointT<double>_>::step(&this->super_BitMatrixCursorF,1.0);
  dVar10 = (this->super_BitMatrixCursorF).p.y;
  corner->x = (this->super_BitMatrixCursorF).p.x;
  corner->y = dVar10;
  dVar10 = (this->super_BitMatrixCursorF).d.x;
  dVar9 = (this->super_BitMatrixCursorF).d.y;
  (this->super_BitMatrixCursorF).d.x = dir.x;
  (this->super_BitMatrixCursorF).d.y = dir.y;
  uVar3 = (uint)(ABS(dVar9) < ABS(dVar10));
  auVar14._0_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar14._4_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar14._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar14._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = -dVar10;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = -dVar9;
  auVar15 = ~auVar14 & auVar15 << 0x40 | auVar11 & auVar14;
  iVar6 = 3;
  for (iVar7 = 1; iVar5 = 1, iVar7 != 4; iVar7 = iVar7 + 1) {
    while( true ) {
      if (iVar5 == 3) break;
      uVar4 = 0;
      while (iVar6 != (int)uVar4) {
        uVar8 = (int)uVar4 + 1;
        uVar3 = -(int)(uVar4 >> 1);
        if ((uVar4 & 1) != 0) {
          uVar3 = uVar8 >> 1;
        }
        local_48 = auVar15._0_8_;
        dStack_40 = auVar15._8_8_;
        auVar17._0_8_ =
             (double)(int)uVar3 * local_48 +
             (this->super_BitMatrixCursorF).d.x * (double)iVar5 + (this->super_BitMatrixCursorF).p.x
        ;
        auVar17._8_8_ =
             (double)(int)uVar3 * dStack_40 +
             (this->super_BitMatrixCursorF).d.y * (double)iVar5 + (this->super_BitMatrixCursorF).p.y
        ;
        pos.x = local_48 + auVar17._0_8_;
        dVar10 = dStack_40 + auVar17._8_8_;
        pos.y = dVar10;
        auVar12._8_8_ = dVar10;
        auVar12._0_8_ = (ulong)dVar10;
        bVar2 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt(&this->super_BitMatrixCursorF,pos);
        uVar4 = (ulong)uVar8;
        if (bVar2) {
          iVar6 = 3;
          goto LAB_00167c34;
        }
      }
      iVar5 = iVar5 + 1;
    }
    iVar6 = iVar6 + 2;
  }
LAB_00167d17:
  p.x = corner->x;
  p.y = corner->y;
  bVar2 = BitMatrixCursor<ZXing::PointT<double>_>::isIn(&this->super_BitMatrixCursorF,p);
  if (bVar2) {
    bVar2 = BitMatrixCursor<ZXing::PointT<double>_>::isIn
                      (&this->super_BitMatrixCursorF,(this->super_BitMatrixCursorF).p);
    return bVar2;
  }
  return false;
LAB_00167c34:
  bVar2 = iVar6 == 0;
  iVar6 = iVar6 + -1;
  if (bVar2) goto LAB_00167d17;
  auVar1._4_8_ = auVar12._8_8_;
  auVar1._0_4_ = auVar17._4_4_;
  auVar13._0_8_ = auVar1._0_8_ << 0x20;
  auVar13._8_4_ = auVar17._8_4_;
  auVar13._12_4_ = auVar17._12_4_;
  dVar10 = auVar13._8_8_;
  local_68._0_8_ = auVar17._0_8_;
  p_00.y = dVar10;
  p_00.x = (double)local_68._0_8_;
  bVar2 = BitMatrixCursor<ZXing::PointT<double>_>::isIn(&this->super_BitMatrixCursorF,p_00);
  if (!bVar2) goto LAB_00167d17;
  pos_00.y = dVar10;
  pos_00.x = (double)local_68._0_8_;
  bVar2 = BitMatrixCursor<ZXing::PointT<double>_>::whiteAt(&this->super_BitMatrixCursorF,pos_00);
  if (bVar2) {
    dVar9 = floor((double)local_68._0_8_);
    dVar10 = floor(dVar10);
    (this->super_BitMatrixCursorF).p.x = dVar9 + 0.5;
    (this->super_BitMatrixCursorF).p.y = dVar10 + 0.5;
    goto LAB_00167d17;
  }
  local_68._0_8_ = (double)local_68._0_8_ - local_48;
  local_68._8_8_ = auVar17._8_8_ - dStack_40;
  pos_01.x = (double)local_68._0_8_ - (this->super_BitMatrixCursorF).d.x;
  pos_01.y = (double)local_68._8_8_ - (this->super_BitMatrixCursorF).d.y;
  bVar2 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt(&this->super_BitMatrixCursorF,pos_01);
  uVar3 = (uint)bVar2;
  auVar12._0_8_ = CONCAT44((int)(uVar3 << 0x1f) >> 0x1f,(int)(uVar3 << 0x1f) >> 0x1f);
  auVar12._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar12._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar16._0_8_ =
       (ulong)((double)local_68._0_8_ - (this->super_BitMatrixCursorF).d.x) & auVar12._0_8_;
  auVar16._8_8_ =
       (ulong)((double)local_68._8_8_ - (this->super_BitMatrixCursorF).d.y) & auVar12._8_8_;
  auVar17 = auVar16 | ~auVar12 & local_68._0_16_;
  goto LAB_00167c34;
}

Assistant:

bool traceCorner(PointF dir, PointF& corner)
	{
		step();
		log(p);
		corner = p;
		std::swap(d, dir);
		traceStep(-1 * dir, 2, false);
		printf("turn: %.0f x %.0f -> %.2f, %.2f\n", p.x, p.y, d.x, d.y);

		return isIn(corner) && isIn(p);
	}